

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O1

Inst * __thiscall mir::inst::CallInst::deep_copy(CallInst *this)

{
  pointer pcVar1;
  CallInst *this_00;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> local_60;
  string local_48;
  VarId local_28;
  
  this_00 = (CallInst *)operator_new(0x50);
  local_28.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  local_28.id = (this->super_Inst).dest.id;
  pcVar1 = (this->func)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->func)._M_string_length);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector(&local_60,&this->params);
  CallInst(this_00,&local_28,&local_48,&local_60);
  if (local_60.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return &this_00->super_Inst;
}

Assistant:

Inst* deep_copy() { return new CallInst(dest, func, params); }